

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQInteger __thiscall SQSharedState::GetMetaMethodIdxByName(SQSharedState *this,SQObjectPtr *name)

{
  bool bVar1;
  SQObjectValue SVar2;
  SQObjectPtr ret;
  SQObjectPtr local_18;
  
  SVar2.nInteger = -1;
  if ((name->super_SQObject)._type == OT_STRING) {
    local_18.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_18.super_SQObject._type = OT_NULL;
    bVar1 = SQTable::Get((this->_metamethodsmap).super_SQObject._unVal.pTable,name,&local_18);
    SVar2.nInteger = -1;
    if (bVar1) {
      SVar2 = local_18.super_SQObject._unVal;
    }
    SQObjectPtr::~SQObjectPtr(&local_18);
  }
  return (SQInteger)SVar2.pTable;
}

Assistant:

SQInteger SQSharedState::GetMetaMethodIdxByName(const SQObjectPtr &name)
{
    if(type(name) != OT_STRING)
        return -1;
    SQObjectPtr ret;
    if(_table(_metamethodsmap)->Get(name,ret)) {
        return _integer(ret);
    }
    return -1;
}